

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O3

string * __thiscall
CLI::detail::rjoin<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
          (string *__return_storage_ptr__,detail *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *v,string *delim)

{
  long lVar1;
  ulong uVar2;
  long lVar3;
  ostringstream s;
  ostringstream aoStack_1a8 [112];
  ios_base local_138 [264];
  
  ::std::__cxx11::ostringstream::ostringstream(aoStack_1a8);
  lVar1 = *(long *)(this + 8);
  if (lVar1 != *(long *)this) {
    lVar3 = -0x20;
    uVar2 = 0;
    do {
      if (uVar2 != 0) {
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)aoStack_1a8,
                   (char *)(v->
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           )._M_impl.super__Vector_impl_data._M_start,
                   (long)(v->
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         )._M_impl.super__Vector_impl_data._M_finish);
        lVar1 = *(long *)(this + 8);
      }
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)aoStack_1a8,*(char **)(lVar1 + lVar3),*(long *)(lVar1 + 8 + lVar3));
      lVar1 = *(long *)(this + 8);
      uVar2 = uVar2 + 1;
      lVar3 = lVar3 + -0x20;
    } while (uVar2 < (ulong)(lVar1 - *(long *)this >> 5));
  }
  ::std::__cxx11::stringbuf::str();
  ::std::__cxx11::ostringstream::~ostringstream(aoStack_1a8);
  ::std::ios_base::~ios_base(local_138);
  return __return_storage_ptr__;
}

Assistant:

std::string rjoin(const T &v, std::string delim = ",") {
    std::ostringstream s;
    for(size_t start = 0; start < v.size(); start++) {
        if(start > 0)
            s << delim;
        s << v[v.size() - start - 1];
    }
    return s.str();
}